

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_prefixes.c
# Opt level: O0

void PrefOpSize(PDISASM pMyDisasm)

{
  int iVar1;
  PDISASM pMyDisasm_local;
  
  iVar1 = Security(2,pMyDisasm);
  if (iVar1 != 0) {
    (pMyDisasm->Prefix).OperandSize = '\x01';
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    ResetREX(pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
    (pMyDisasm->Prefix).Number = (pMyDisasm->Prefix).Number + 1;
    (pMyDisasm->Reserved_).NB_PREFIX = (pMyDisasm->Reserved_).NB_PREFIX + 1;
    (pMyDisasm->Reserved_).OriginalOperandSize = (pMyDisasm->Reserved_).OperandSize;
    if ((pMyDisasm->Reserved_).Architecture == 0x10) {
      (pMyDisasm->Reserved_).OperandSize = 0x20;
    }
    else if ((pMyDisasm->Reserved_).OperandSize != 0x40) {
      (pMyDisasm->Reserved_).OperandSize = 0x10;
    }
    (pMyDisasm->Instruction).Opcode = (uint)*(byte *)(pMyDisasm->Reserved_).EIP_;
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      if ((pMyDisasm->Reserved_).VEX.mmmmm == '\x01') {
        (*opcode_map2[*(byte *)(pMyDisasm->Reserved_).EIP_])(pMyDisasm);
      }
      else if ((pMyDisasm->Reserved_).VEX.mmmmm == '\x02') {
        (*opcode_map3[*(byte *)(pMyDisasm->Reserved_).EIP_])(pMyDisasm);
      }
      else if ((pMyDisasm->Reserved_).VEX.mmmmm == '\x03') {
        (*opcode_map4[*(byte *)(pMyDisasm->Reserved_).EIP_])(pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      (*opcode_map1[*(byte *)(pMyDisasm->Reserved_).EIP_])(pMyDisasm);
    }
    if ((pMyDisasm->Reserved_).Architecture == 0x10) {
      (pMyDisasm->Reserved_).OperandSize = 0x10;
    }
    else {
      (pMyDisasm->Reserved_).OperandSize = 0x20;
    }
  }
  return;
}

Assistant:

void __bea_callspec__ PrefOpSize(PDISASM pMyDisasm)
{
    if (!Security(2, pMyDisasm)) return;
    pMyDisasm->Prefix.OperandSize = InUsePrefix;
    if (GV.VEX.state == InUsePrefix) GV.ERROR_OPCODE = UD_;
    ResetREX(pMyDisasm);
    GV.EIP_++;
    pMyDisasm->Prefix.Number++;
    GV.NB_PREFIX++;
    GV.OriginalOperandSize = GV.OperandSize;  /* if GV.OperandSize is used as a mandatory prefix, keep the real operandsize value */
    if (GV.Architecture == 16) {
        GV.OperandSize = 32;
    }
    else {
        if (GV.OperandSize != 64) {
            GV.OperandSize = 16;
        }
    }
    pMyDisasm->Instruction.Opcode = *((UInt8*) GV.EIP_);
    if (GV.VEX.state != InUsePrefix) {
        (void) opcode_map1[*((UInt8*) GV.EIP_)](pMyDisasm);
    }
    else if (GV.VEX.mmmmm == 0x1) {
        (void) opcode_map2[*((UInt8*) GV.EIP_)](pMyDisasm);
    }
    else if (GV.VEX.mmmmm == 0x2) {
        (void) opcode_map3[*((UInt8*) GV.EIP_)](pMyDisasm);
    }
    else if (GV.VEX.mmmmm == 0x3) {
        (void) opcode_map4[*((UInt8*) GV.EIP_)](pMyDisasm);
    }
    else {
        failDecode(pMyDisasm);
    }
    if (GV.Architecture == 16) {
        GV.OperandSize = 16;
    }
    else {
        GV.OperandSize = 32;
    }
}